

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O3

uint32_t helper_atomic_cmpxchgw_le_aarch64
                   (CPUArchState_conflict1 *env,target_ulong addr,uint32_t cmpv,uint32_t newv,
                   TCGMemOpIdx oi)

{
  ushort uVar1;
  ushort *puVar2;
  uintptr_t unaff_retaddr;
  
  puVar2 = (ushort *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  LOCK();
  uVar1 = *puVar2;
  if ((ushort)cmpv == uVar1) {
    *puVar2 = (ushort)newv;
    uVar1 = (ushort)cmpv;
  }
  UNLOCK();
  return (uint32_t)uVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, cmpv, newv);
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, cmpv, newv);
#else
    ret = atomic_cmpxchg__nocheck(haddr, cmpv, newv);
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return ret;
}